

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_write(qpdf_data qpdf)

{
  _func_void__qpdf_data_ptr *local_40;
  function<void_(_qpdf_data_*)> local_38;
  int local_14;
  qpdf_data p_Stack_10;
  QPDF_ERROR_CODE status;
  qpdf_data qpdf_local;
  
  local_14 = 0;
  local_40 = call_write;
  p_Stack_10 = qpdf;
  std::function<void(_qpdf_data*)>::function<void(*)(_qpdf_data*),void>
            ((function<void(_qpdf_data*)> *)&local_38,&local_40);
  local_14 = trap_errors(qpdf,&local_38);
  std::function<void_(_qpdf_data_*)>::~function(&local_38);
  QTC::TC("qpdf","qpdf-c called qpdf_write",(uint)(local_14 != 0));
  return local_14;
}

Assistant:

QPDF_ERROR_CODE
qpdf_write(qpdf_data qpdf)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    status = trap_errors(qpdf, &call_write);
    QTC::TC("qpdf", "qpdf-c called qpdf_write", (status == 0) ? 0 : 1);
    return status;
}